

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

double __thiscall toml::Value::ValueConverter<double>::to(ValueConverter<double> *this,Value *v)

{
  char *local_10;
  char *local_8;
  
  if (v->type_ == DOUBLE_TYPE) {
    return (double)(v->field_1).null_;
  }
  local_8 = typeToString(v->type_);
  local_10 = "double";
  failwith<char_const(&)[27],char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
            ((char (*) [27])"type error: this value is ",&local_8,(char (*) [6])" but ",&local_10,
             (char (*) [15])" was requested");
}

Assistant:

Type type() const { return type_; }